

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void error_to_str_test(void)

{
  int iVar1;
  char *pcVar2;
  fdb_status err_code;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  err_code = FDB_RESULT_SUCCESS;
  do {
    if (err_code < FDB_RESULT_ALREADY_COMPACTED) {
      pcVar2 = fdb_error_msg(0xffffffb6);
      iVar1 = strcmp(pcVar2,"unknown error");
      if (iVar1 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x3d0);
        error_to_str_test()::__test_pass = '\x01';
        iVar1 = strcmp(pcVar2,"unknown error");
        if (iVar1 != 0) {
          __assert_fail("!strcmp(err_msg, \"unknown error\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x3d0,"void error_to_str_test()");
        }
      }
      memleak_end();
      pcVar2 = "%s PASSED\n";
      if (error_to_str_test()::__test_pass != '\0') {
        pcVar2 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar2,"error to string message test");
      return;
    }
    pcVar2 = fdb_error_msg(err_code);
    iVar1 = strcmp(pcVar2,"unknown error");
    if (iVar1 == 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x3cb);
      error_to_str_test()::__test_pass = '\x01';
      iVar1 = strcmp(pcVar2,"unknown error");
      if (iVar1 == 0) {
        __assert_fail("strcmp(err_msg, \"unknown error\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x3cb,"void error_to_str_test()");
      }
    }
    err_code = err_code + FDB_RESULT_INVALID_ARGS;
  } while( true );
}

Assistant:

void error_to_str_test()
{
    TEST_INIT();
    memleak_start();
    int i;
    const char *err_msg;

    for (i = FDB_RESULT_SUCCESS; i >= FDB_RESULT_LAST; --i) {
        err_msg = fdb_error_msg((fdb_status)i);
        // Verify that all error codes have corresponding error messages
        TEST_CHK(strcmp(err_msg, "unknown error"));
    }

    err_msg = fdb_error_msg((fdb_status)i);
    // Verify that the last error code has been checked
    TEST_CHK(!strcmp(err_msg, "unknown error"));

    memleak_end();
    TEST_RESULT("error to string message test");
}